

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,EnumDescriptorProto *proto,LocationRecorder *enum_location)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  string_view text;
  ErrorMaker error;
  LocationRecorder location;
  Token start_token;
  LocationRecorder LStack_78;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  ColumnNumber local_30;
  
  pTVar2 = this->input_;
  local_60._0_4_ = (pTVar2->current_).type;
  pcVar3 = (pTVar2->current_).text._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (pTVar2->current_).text._M_string_length);
  local_30 = (pTVar2->current_).end_column;
  local_38._0_4_ = (pTVar2->current_).line;
  local_38._4_4_ = (pTVar2->current_).column;
  text._M_str = "reserved";
  text._M_len = 8;
  bVar4 = Consume(this,text);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_001ffac6;
  }
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_IDENTIFIER) {
    iVar5 = std::__cxx11::string::compare((char *)&this->syntax_identifier_);
    if (iVar5 != 0) {
      pcVar6 = "Reserved names must be string literals. (Only editions supports identifiers.)";
LAB_001ffa6f:
      bVar4 = false;
      error.func_ = (_func_string_void_ptr *)0x0;
      error.field_0.error_ = pcVar6;
      RecordError(this,error);
      goto LAB_001ffac6;
    }
    LocationRecorder::Init(&LStack_78,enum_location,enum_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_78.location_)->field_0)._impl_.path_,5);
    LocationRecorder::StartAt(&LStack_78,(Token *)local_60);
    bVar4 = ParseReservedIdentifiers(this,proto,&LStack_78);
  }
  else if (TVar1 == TYPE_STRING) {
    iVar5 = std::__cxx11::string::compare((char *)&this->syntax_identifier_);
    if (iVar5 == 0) {
      pcVar6 = "Reserved names must be identifiers in editions, not string literals.";
      goto LAB_001ffa6f;
    }
    LocationRecorder::Init(&LStack_78,enum_location,enum_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_78.location_)->field_0)._impl_.path_,5);
    LocationRecorder::StartAt(&LStack_78,(Token *)local_60);
    bVar4 = ParseReservedNames(this,proto,&LStack_78);
  }
  else {
    LocationRecorder::Init(&LStack_78,enum_location,enum_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_78.location_)->field_0)._impl_.path_,4);
    LocationRecorder::StartAt(&LStack_78,(Token *)local_60);
    bVar4 = ParseReservedNumbers(this,proto,&LStack_78);
  }
  LocationRecorder::~LocationRecorder(&LStack_78);
LAB_001ffac6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool Parser::ParseReserved(EnumDescriptorProto* proto,
                           const LocationRecorder& enum_location) {
  io::Tokenizer::Token start_token = input_->current();
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    if (syntax_identifier_ == "editions") {
      RecordError(
          "Reserved names must be identifiers in editions, not string "
          "literals.");
      return false;
    }
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNames(proto, location);
  } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    if (syntax_identifier_ != "editions") {
      RecordError(
          "Reserved names must be string literals. (Only editions supports "
          "identifiers.)");
      return false;
    }
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedIdentifiers(proto, location);
  } else {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedRangeFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNumbers(proto, location);
  }
}